

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void input(State *state)

{
  Controller *this;
  Tempo TVar1;
  microseconds mVar2;
  char cVar3;
  longlong lVar4;
  longlong lVar5;
  microseconds mVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  _Head_base<0UL,_double,_false> _Var10;
  timespec ts;
  timespec ts_1;
  Timeline local_58;
  timespec local_40;
  
  cVar3 = std::istream::get();
  this = &(state->link).mController;
  ableton::link::
  Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
  ::timeline(&local_58,this);
  mVar2.__r = local_58.timeOrigin.__r;
  TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.super__Head_base<0UL,_double,_false>.
  _M_head_impl = (tuple<double>)(tuple<double>)local_58.tempo;
  clock_gettime(1,(timespec *)&local_58);
  uVar7 = (ulong)((long)local_58.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                        super__Head_base<0UL,_double,_false>._M_head_impl * 1000000000 +
                 (long)local_58.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
                       super__Head_base<0UL,_long,_false>._M_head_impl) / 1000;
  mVar6.__r = mVar2.__r;
  _Var10._M_head_impl = (double)TVar1;
  switch((int)cVar3) {
  case 0x71:
    LOCK();
    (state->running)._M_base._M_i = false;
    UNLOCK();
    clearLine();
    return;
  case 0x72:
    dVar8 = state->quantum + -1.0;
    break;
  case 0x73:
  case 0x75:
  case 0x76:
    goto switchD_00149335_caseD_73;
  case 0x74:
    dVar8 = state->quantum + 1.0;
    break;
  case 0x77:
    dVar8 = -1.0;
    goto LAB_00149382;
  default:
    if (cVar3 != 0x65) goto switchD_00149335_caseD_73;
    dVar8 = 1.0;
LAB_00149382:
    lVar4 = llround(60000000.0 /
                    (double)TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                            super__Head_base<0UL,_double,_false>._M_head_impl);
    lVar4 = llround(((double)(long)(uVar7 - mVar2.__r) / (double)lVar4) * 1000000.0);
    dVar9 = 20.0;
    if (20.0 <= dVar8 + (double)TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                                super__Head_base<0UL,_double,_false>._M_head_impl) {
      dVar9 = dVar8 + (double)TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                              super__Head_base<0UL,_double,_false>._M_head_impl;
    }
    _Var10._M_head_impl = 999.0;
    if (dVar9 <= 999.0) {
      _Var10._M_head_impl = dVar9;
    }
    lVar5 = llround(60000000.0 / _Var10._M_head_impl);
    lVar4 = llround((double)lVar5 * ((double)-lVar4 / 1000000.0));
    mVar6.__r = lVar4 + uVar7;
    goto switchD_00149335_caseD_73;
  }
  state->quantum = dVar8;
switchD_00149335_caseD_73:
  if ((((double)TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                super__Head_base<0UL,_double,_false>._M_head_impl != _Var10._M_head_impl) ||
      (NAN((double)TVar1.super_tuple<double>.super__Tuple_impl<0UL,_double>.
                   super__Head_base<0UL,_double,_false>._M_head_impl) || NAN(_Var10._M_head_impl)))
     || (mVar2.__r != mVar6.__r)) {
    local_58.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl =
         (tuple<double>)(tuple<double>)_Var10._M_head_impl;
    local_58.timeOrigin.__r = mVar6.__r;
    clock_gettime(1,&local_40);
    ableton::link::
    Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>
    ::setTimeline(this,&local_58,
                  (microseconds)((ulong)(local_40.tv_sec * 1000000000 + local_40.tv_nsec) / 1000));
  }
  input(state);
  return;
}

Assistant:

void input(State& state)
{
  char in;

#if defined(LINK_PLATFORM_WINDOWS)
  HANDLE stdinHandle = GetStdHandle(STD_INPUT_HANDLE);
  DWORD numCharsRead;
  INPUT_RECORD inputRecord;
  do
  {
    ReadConsoleInput(stdinHandle, &inputRecord, 1, &numCharsRead);
  } while ((inputRecord.EventType != KEY_EVENT) || inputRecord.Event.KeyEvent.bKeyDown);
  in = inputRecord.Event.KeyEvent.uChar.AsciiChar;
#elif defined(LINK_PLATFORM_UNIX)
  in = std::cin.get();
#endif
  auto timeLine = state.link.captureAppTimeline();
  const auto tempo = timeLine.tempo();

  std::chrono::microseconds updateAt = state.link.clock().micros();

  switch (in)
  {
    case 'q':
      state.running = false;
      clearLine();
      return;
    case 'w':
      timeLine.setTempo(tempo-1,updateAt);
      break;
    case 'e':
      timeLine.setTempo(tempo+1,updateAt);
      break;
    case 'r':
      state.quantum -= 1;
      break;
    case 't':
      state.quantum += 1;
      break;
  }
  state.link.commitAppTimeline(timeLine);
  input(state);
}